

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_object(parser *this,lexer *l,size_t nesting_depth)

{
  _func_int **st;
  token_type tVar1;
  json_parser_exception *pjVar2;
  size_t sVar3;
  json *this_00;
  token *ptVar4;
  string *s;
  _func_int **in_RCX;
  token *t2;
  token *t1;
  size_t nesting_depth_local;
  lexer *l_local;
  parser *this_local;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *object;
  
  if ((l->m_token)._vptr_token < in_RCX) {
    pjVar2 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    st = (l->m_token)._vptr_token;
    sVar3 = reader::get_byte_index((reader *)l->_vptr_lexer);
    json_parser_exception::json_parser_exception
              (pjVar2,maximum_nesting_depth_exceeded_e,(size_t)st,sVar3);
    __cxa_throw(pjVar2,&json_parser_exception::typeinfo,
                json_parser_exception::~json_parser_exception);
  }
  this_00 = (json *)operator_new(0x58);
  json::json(this_00,object_e);
  std::unique_ptr<argo::json,std::default_delete<argo::json>>::
  unique_ptr<std::default_delete<argo::json>,void>
            ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,this_00);
  ptVar4 = lexer::next((lexer *)nesting_depth);
  tVar1 = token::get_type(ptVar4);
  if (tVar1 != end_object_e) {
    lexer::put_back_last((lexer *)nesting_depth);
    while( true ) {
      parse_name_value_pair
                ((parser *)l,(lexer *)nesting_depth,
                 (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)this,(size_t)in_RCX);
      ptVar4 = lexer::next((lexer *)nesting_depth);
      tVar1 = token::get_type(ptVar4);
      if (tVar1 == end_object_e) break;
      tVar1 = token::get_type(ptVar4);
      if (tVar1 != value_separator_e) {
        pjVar2 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
        s = token::get_raw_value_abi_cxx11_(ptVar4);
        sVar3 = reader::get_byte_index((reader *)l->_vptr_lexer);
        json_parser_exception::json_parser_exception(pjVar2,unexpected_token_e,s,sVar3);
        __cxa_throw(pjVar2,&json_parser_exception::typeinfo,
                    json_parser_exception::~json_parser_exception);
      }
    }
  }
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse_object(lexer &l, size_t nesting_depth)
{
    if (nesting_depth > m_max_nesting_depth)
    {
        throw json_parser_exception(
                            json_parser_exception::maximum_nesting_depth_exceeded_e,
                            m_max_nesting_depth,
                            m_reader.get_byte_index());
    }

    unique_ptr<json> object = unique_ptr<json>(new json(json::object_e));

    const token &t1 = l.next();

    // check for empty object
    if (t1.get_type() == token::end_object_e)
    {
        return object;
    }
    else
    {
        l.put_back_last();
    }

    while (true)
    {
        parse_name_value_pair(l, object, nesting_depth);

        const token &t2 = l.next();

        if (t2.get_type() == token::end_object_e)
        {
            return object;
        }
        else if (t2.get_type() == token::value_separator_e)
        {
            continue;
        }
        else
        {
            throw json_parser_exception(
                        json_parser_exception::unexpected_token_e,
                        t2.get_raw_value(),
                        m_reader.get_byte_index());
        }
    }

    return object;
}